

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

bool __thiscall ON_wString::Insert(ON_wString *this,int index,wchar_t ch,int insert_count)

{
  ON_wStringHeader *pOVar1;
  ulong uVar2;
  wchar_t *__src;
  int local_4c;
  int i;
  unsigned_long move_bytes;
  wchar_t *p;
  size_t new_length;
  size_t length;
  int insert_count_local;
  wchar_t ch_local;
  int index_local;
  ON_wString *this_local;
  
  if (((index < 0) || (insert_count < 0)) || (ch == L'\0')) {
    this_local._7_1_ = false;
  }
  else {
    pOVar1 = Header(this);
    uVar2 = (ulong)pOVar1->string_length;
    if (uVar2 < (ulong)(long)index) {
      this_local._7_1_ = false;
    }
    else {
      ReserveArray(this,uVar2 + (long)insert_count);
      __src = this->m_s + index;
      memmove(__src + insert_count,__src,((uVar2 - (long)index) + 1) * 4);
      for (local_4c = 0; local_4c < insert_count; local_4c = local_4c + 1) {
        __src[local_4c] = ch;
      }
      pOVar1 = Header(this);
      pOVar1->string_length = (int)(uVar2 + (long)insert_count);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_wString::Insert(int index, wchar_t ch, int insert_count)
{
  if ((index < 0) || (insert_count < 0) || (ch == 0))
    return false;

  const auto length = size_t(Header()->string_length);
  if (index > length)
    return false;

  const auto new_length = length + insert_count;
  ReserveArray(new_length);

  auto* p = m_s + index;
  const auto move_bytes = (length - index + 1) * sizeof(wchar_t);
  memmove(p + insert_count, p, move_bytes);

  for (int i = 0; i < insert_count; i++)
  {
    p[i] = ch;
  }

  Header()->string_length = int(new_length);

  return true;
}